

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFSwabShort(uint16_t *wp)

{
  undefined1 uVar1;
  uchar t;
  uchar *cp;
  uint16_t *wp_local;
  
  uVar1 = *(undefined1 *)((long)wp + 1);
  *(char *)((long)wp + 1) = (char)*wp;
  *(undefined1 *)wp = uVar1;
  return;
}

Assistant:

void TIFFSwabShort(uint16_t *wp)
{
    register unsigned char *cp = (unsigned char *)wp;
    unsigned char t;
    assert(sizeof(uint16_t) == 2);
    t = cp[1];
    cp[1] = cp[0];
    cp[0] = t;
}